

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

int xmlRegExecErrInfo(xmlRegExecCtxtPtr exec,xmlChar **string,int *nbval,int *nbneg,xmlChar **values
                     ,int *terminal)

{
  int iVar1;
  xmlChar *pxVar2;
  
  if (exec != (xmlRegExecCtxtPtr)0x0) {
    if (string != (xmlChar **)0x0) {
      if (exec->status == 0) {
        pxVar2 = (xmlChar *)0x0;
      }
      else {
        pxVar2 = exec->errString;
      }
      *string = pxVar2;
    }
    iVar1 = xmlRegExecGetValues(exec,1,nbval,nbneg,values,terminal);
    return iVar1;
  }
  return -1;
}

Assistant:

int
xmlRegExecErrInfo(xmlRegExecCtxtPtr exec, const xmlChar **string,
                  int *nbval, int *nbneg, xmlChar **values, int *terminal) {
    if (exec == NULL)
        return(-1);
    if (string != NULL) {
        if (exec->status != XML_REGEXP_OK)
	    *string = exec->errString;
	else
	    *string = NULL;
    }
    return(xmlRegExecGetValues(exec, 1, nbval, nbneg, values, terminal));
}